

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

Descriptor *
cfd::core::Descriptor::CreateDescriptor
          (Descriptor *__return_storage_ptr__,
          vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
          *type_list,
          vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
          *key_info_list,uint32_t require_num,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  undefined8 *puVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  DescriptorScriptType DVar4;
  pointer pDVar5;
  pointer pDVar6;
  Descriptor *pDVar7;
  char cVar8;
  char cVar9;
  DescriptorNodeScriptData *node_data;
  undefined8 *puVar10;
  long *plVar11;
  CfdException *pCVar12;
  uint32_t uVar13;
  long lVar14;
  size_type *psVar15;
  long *plVar16;
  pointer this;
  ulong uVar17;
  _Alloc_hider _Var18;
  bool bVar19;
  string output_descriptor;
  string key_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_> types;
  undefined1 local_170 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [20];
  uint32_t local_10c;
  string local_108;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  pointer local_c8;
  ulong *local_c0;
  uint local_b8;
  undefined4 uStack_b4;
  ulong local_b0 [2];
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_> *local_60;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_58;
  Descriptor *local_50;
  vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_> local_48
  ;
  
  local_10c = require_num;
  local_60 = key_info_list;
  if ((type_list->
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (type_list->
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_150._0_8_ = "cfdcore_descriptor.cpp";
    local_150._8_4_ = 0x806;
    local_140._M_allocated_capacity = 0x5e7e14;
    logger::log<>((CfdSourceLocation *)local_150,kCfdLogLevelWarning,"Failed to type list.");
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    local_150._0_8_ = &local_140;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"Failed to type list. list is empty.","");
    CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_150);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_150._0_8_ = &local_140;
  local_150._8_8_ = 0;
  local_140._M_allocated_capacity = local_140._M_allocated_capacity & 0xffffffffffffff00;
  local_58 = network_parameters;
  local_50 = __return_storage_ptr__;
  ::std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>::
  vector(&local_48,type_list);
  if (local_48.
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar3 = &local_108.field_2;
    do {
      local_130 = local_120;
      DVar4 = local_48.
              super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1];
      local_128 = 0;
      local_120[0] = 0;
      local_c8 = local_48.
                 super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_150._8_8_ == 0) {
        pDVar5 = (local_60->
                 super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (this = (local_60->
                    super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start; this != pDVar5; this = this + 1) {
          if (local_128 == 0) {
            DescriptorKeyInfo::ToString_abi_cxx11_((string *)local_170,this);
            ::std::__cxx11::string::operator=((string *)&local_130,(string *)local_170);
            _Var18._M_p = (pointer)local_170._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._0_8_ != &local_160) goto LAB_00327472;
          }
          else {
            DescriptorKeyInfo::ToString_abi_cxx11_(&local_108,this);
            plVar11 = (long *)::std::__cxx11::string::replace
                                        ((ulong)&local_108,0,(char *)0x0,0x5e7e12);
            local_170._0_8_ = &local_160;
            psVar15 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_160._M_allocated_capacity = *psVar15;
              local_160._8_8_ = plVar11[3];
            }
            else {
              local_160._M_allocated_capacity = *psVar15;
              local_170._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar11;
            }
            local_170._8_8_ = plVar11[1];
            *plVar11 = (long)psVar15;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)&local_130,local_170._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._0_8_ != &local_160) {
              operator_delete((void *)local_170._0_8_);
            }
            _Var18._M_p = local_108._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != paVar3) {
LAB_00327472:
              operator_delete(_Var18._M_p);
            }
          }
        }
      }
      local_c8 = local_c8 + -1;
      lVar14 = 0;
      do {
        plVar11 = (long *)((long)&kDescriptorNodeScriptTable + lVar14);
        if (DVar4 == *(DescriptorScriptType *)((long)&DAT_0076c940 + lVar14)) break;
        bVar19 = lVar14 != 400;
        lVar14 = lVar14 + 0x28;
        plVar11 = (long *)0x0;
      } while (bVar19);
      if (DVar4 - kDescriptorScriptPk < 6) {
        if (local_150._8_8_ != 0) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x82a;
          local_160._M_allocated_capacity = 0x5e7e14;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,
                        "key hash type is bottom only.");
          pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,"Failed to createDescriptor. key hash type is bottom only."
                     ,"");
          CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (local_128 == 0) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x830;
          local_160._M_allocated_capacity = 0x5e7e14;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,"key list is empty");
          pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,"Failed to createDescriptor. key list is empty.","");
          CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if ((*(char *)((long)plVar11 + 0x26) == '\0') &&
           (1 < (ulong)(((long)(local_60->
                               super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_60->
                               super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 5) * 0x4ec4ec4ec4ec4ec5
                       ))) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x836;
          local_160._M_allocated_capacity = 0x5e7e14;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,
                        "multiple key is multisig only.");
          pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,
                     "Failed to createDescriptor. multiple key is multisig only.","");
          CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
      else {
        if (1 < DVar4 - kDescriptorScriptSh) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x849;
          local_160._M_allocated_capacity = 0x5e7e14;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,"Failed to script type.")
          ;
          pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,"Failed to script type. this type is unsupported.","");
          CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (local_150._8_8_ == 0) {
          local_170._0_8_ = "cfdcore_descriptor.cpp";
          local_170._8_4_ = 0x83f;
          local_160._M_allocated_capacity = 0x5e7e14;
          logger::log<>((CfdSourceLocation *)local_170,kCfdLogLevelWarning,
                        "Failed to script hash type.");
          pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,
                     "Failed to script hash type. this type is unsupported of key.","");
          CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_170);
          __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
      if (local_128 == 0) {
        local_e8 = &local_d8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,*plVar11,plVar11[1] + *plVar11);
        ::std::__cxx11::string::append((char *)&local_e8);
        puVar10 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_e8,local_150._0_8_)
        ;
        psVar15 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_108.field_2._M_allocated_capacity = *psVar15;
          local_108.field_2._8_8_ = puVar10[3];
          local_108._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar15;
          local_108._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_108._M_string_length = puVar10[1];
        *puVar10 = psVar15;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_108);
LAB_003276aa:
        psVar15 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_160._M_allocated_capacity = *psVar15;
          local_160._8_8_ = puVar10[3];
          local_170._0_8_ = &local_160;
        }
        else {
          local_160._M_allocated_capacity = *psVar15;
          local_170._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar10;
        }
        local_170._8_8_ = puVar10[1];
        *puVar10 = psVar15;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)local_150,(string *)local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._0_8_ != &local_160) {
          operator_delete((void *)local_170._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar3) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        local_48.
        super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
        ._M_impl.super__Vector_impl_data._M_finish = local_c8;
        if (local_e8 != &local_d8) {
          operator_delete(local_e8);
          local_48.
          super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
          ._M_impl.super__Vector_impl_data._M_finish = local_c8;
        }
      }
      else {
        if (*(char *)((long)plVar11 + 0x26) != '\x01') {
          local_e8 = &local_d8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,*plVar11,plVar11[1] + *plVar11);
          ::std::__cxx11::string::append((char *)&local_e8);
          puVar10 = (undefined8 *)
                    ::std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_130);
          psVar15 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_108.field_2._M_allocated_capacity = *psVar15;
            local_108.field_2._8_8_ = puVar10[3];
            local_108._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_108.field_2._M_allocated_capacity = *psVar15;
            local_108._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_108._M_string_length = puVar10[1];
          *puVar10 = psVar15;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_108);
          goto LAB_003276aa;
        }
        local_a0 = local_90;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,*plVar11,plVar11[1] + *plVar11);
        ::std::__cxx11::string::append((char *)&local_a0);
        cVar9 = '\x01';
        if (9 < local_10c) {
          uVar13 = local_10c;
          cVar8 = '\x04';
          do {
            cVar9 = cVar8;
            if (uVar13 < 100) {
              cVar9 = cVar9 + -2;
              goto LAB_0032773d;
            }
            if (uVar13 < 1000) {
              cVar9 = cVar9 + -1;
              goto LAB_0032773d;
            }
            if (uVar13 < 10000) goto LAB_0032773d;
            bVar19 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar8 = cVar9 + '\x04';
          } while (bVar19);
          cVar9 = cVar9 + '\x01';
        }
LAB_0032773d:
        local_c0 = local_b0;
        ::std::__cxx11::string::_M_construct((ulong)&local_c0,cVar9);
        ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_c0,local_b8,local_10c);
        uVar17 = 0xf;
        if (local_a0 != local_90) {
          uVar17 = local_90[0];
        }
        uVar2 = CONCAT44(uStack_b4,local_b8) + local_98;
        if (uVar17 < uVar2) {
          uVar17 = 0xf;
          if (local_c0 != local_b0) {
            uVar17 = local_b0[0];
          }
          if (uVar17 < uVar2) goto LAB_003277d5;
          puVar10 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_a0);
        }
        else {
LAB_003277d5:
          puVar10 = (undefined8 *)
                    ::std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0);
        }
        puVar1 = puVar10 + 2;
        if ((undefined8 *)*puVar10 == puVar1) {
          local_70 = *puVar1;
          uStack_68 = puVar10[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *puVar1;
          local_80 = (undefined8 *)*puVar10;
        }
        local_78 = puVar10[1];
        *puVar10 = puVar1;
        puVar10[1] = 0;
        *(undefined1 *)puVar1 = 0;
        plVar11 = (long *)::std::__cxx11::string::append((char *)&local_80);
        plVar16 = plVar11 + 2;
        if ((long *)*plVar11 == plVar16) {
          local_d8 = *plVar16;
          lStack_d0 = plVar11[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar16;
          local_e8 = (long *)*plVar11;
        }
        local_e0 = plVar11[1];
        *plVar11 = (long)plVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        puVar10 = (undefined8 *)
                  ::std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_130);
        psVar15 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_108.field_2._M_allocated_capacity = *psVar15;
          local_108.field_2._8_8_ = puVar10[3];
          local_108._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar15;
          local_108._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_108._M_string_length = puVar10[1];
        *puVar10 = psVar15;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_108);
        psVar15 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_160._M_allocated_capacity = *psVar15;
          local_160._8_8_ = puVar10[3];
          local_170._0_8_ = &local_160;
        }
        else {
          local_160._M_allocated_capacity = *psVar15;
          local_170._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar10;
        }
        local_170._8_8_ = puVar10[1];
        *puVar10 = psVar15;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)local_150,(string *)local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._0_8_ != &local_160) {
          operator_delete((void *)local_170._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar3) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8);
        }
        pDVar6 = local_c8;
        if (local_80 != &local_70) {
          operator_delete(local_80);
        }
        if (local_c0 != local_b0) {
          operator_delete(local_c0);
        }
        local_48.
        super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar6;
        if (local_a0 != local_90) {
          operator_delete(local_a0);
        }
      }
      if (local_130 != local_120) {
        operator_delete(local_130);
      }
    } while (local_48.
             super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             local_48.
             super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  pDVar7 = local_50;
  Parse(local_50,(string *)local_150,local_58);
  if (local_48.
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._0_8_ != &local_140) {
    operator_delete((void *)local_150._0_8_);
  }
  return pDVar7;
}

Assistant:

Descriptor Descriptor::CreateDescriptor(
    const std::vector<DescriptorScriptType>& type_list,
    const std::vector<DescriptorKeyInfo>& key_info_list, uint32_t require_num,
    const std::vector<AddressFormatData>* network_parameters) {
  if (type_list.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to type list.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to type list. list is empty.");
  }
  std::string output_descriptor;
  std::vector<DescriptorScriptType> types(type_list);
  for (auto ite = types.rbegin(); ite != types.rend(); ++ite) {
    DescriptorScriptType type = *ite;

    std::string key_text;
    if (output_descriptor.empty() && (!key_info_list.empty())) {
      for (const auto& key_info : key_info_list) {
        if (key_text.empty()) {
          key_text = key_info.ToString();
        } else {
          key_text += "," + key_info.ToString();
        }
      }
    }

    const DescriptorNodeScriptData* p_data = nullptr;
    for (const auto& node_data : kDescriptorNodeScriptTable) {
      if (type == node_data.type) {
        p_data = &node_data;
        break;
      }
    }
    switch (type) {
      case DescriptorScriptType::kDescriptorScriptPk:
      case DescriptorScriptType::kDescriptorScriptPkh:
      case DescriptorScriptType::kDescriptorScriptWpkh:
      case DescriptorScriptType::kDescriptorScriptCombo:
      case DescriptorScriptType::kDescriptorScriptMulti:
      case DescriptorScriptType::kDescriptorScriptSortedMulti:
        if (!output_descriptor.empty()) {
          warn(CFD_LOG_SOURCE, "key hash type is bottom only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. key hash type is bottom only.");
        }
        if (key_text.empty()) {
          warn(CFD_LOG_SOURCE, "key list is empty");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. key list is empty.");
        }
        if ((!p_data->multisig) && (key_info_list.size() > 1)) {
          warn(CFD_LOG_SOURCE, "multiple key is multisig only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. multiple key is multisig only.");
        }
        break;
      case DescriptorScriptType::kDescriptorScriptSh:
      case DescriptorScriptType::kDescriptorScriptWsh:
        if (output_descriptor.empty()) {
          warn(CFD_LOG_SOURCE, "Failed to script hash type.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to script hash type. this type is unsupported of key.");
        }
        break;
      case DescriptorScriptType::kDescriptorScriptNull:
      case DescriptorScriptType::kDescriptorScriptAddr:
      case DescriptorScriptType::kDescriptorScriptRaw:
      default:
        warn(CFD_LOG_SOURCE, "Failed to script type.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to script type. this type is unsupported.");
        break;
    }

    if (key_text.empty()) {
      output_descriptor = p_data->name + "(" + output_descriptor + ")";
    } else if (p_data->multisig) {
      output_descriptor = p_data->name + "(" + std::to_string(require_num) +
                          "," + key_text + ")";
    } else {
      output_descriptor = p_data->name + "(" + key_text + ")";
    }
  }

  // Check descriptor script format.
  return Parse(output_descriptor, network_parameters);
}